

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbcore.c
# Opt level: O1

void set_cmninit(feat_t *fcb,char *cmninit)

{
  bool bVar1;
  char *__s;
  char *pcVar2;
  cmn_t *pcVar3;
  char *pcVar4;
  long lVar5;
  double dVar6;
  
  if ((cmninit == (char *)0x0) || (fcb->cmn_struct == (cmn_t *)0x0)) {
    return;
  }
  __s = __ckd_salloc__(cmninit,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                       ,0x1a4);
  pcVar3 = fcb->cmn_struct;
  bVar1 = 0 < pcVar3->veclen;
  if (0 < pcVar3->veclen) {
    pcVar2 = strchr(__s,0x2c);
    pcVar4 = __s;
    if (pcVar2 == (char *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      do {
        *pcVar2 = '\0';
        dVar6 = atof(pcVar4);
        pcVar3 = fcb->cmn_struct;
        pcVar3->cmn_mean[lVar5] = (mfcc_t)(float)dVar6;
        lVar5 = lVar5 + 1;
        bVar1 = lVar5 < pcVar3->veclen;
        if (pcVar3->veclen <= lVar5) goto LAB_00110bdd;
        pcVar4 = pcVar2 + 1;
        pcVar2 = strchr(pcVar4,0x2c);
      } while (pcVar2 != (char *)0x0);
    }
    if ((bVar1) && (*pcVar4 != '\0')) {
      dVar6 = atof(pcVar4);
      pcVar3->cmn_mean[lVar5] = (mfcc_t)(float)dVar6;
    }
  }
LAB_00110bdd:
  ckd_free(__s);
  return;
}

Assistant:

void
set_cmninit(feat_t *fcb, char const *cmninit)
{
    char *c, *cc, *vallist;
    int32 nvals;

    if (cmninit == NULL)
        return;
    if (fcb->cmn_struct == NULL)
	return;
    vallist = ckd_salloc(cmninit);
    c = vallist;
    nvals = 0;
    while (nvals < fcb->cmn_struct->veclen
           && (cc = strchr(c, ',')) != NULL) {
        *cc = '\0';
        fcb->cmn_struct->cmn_mean[nvals] = atof(c);
        c = cc + 1;
        ++nvals;
    }
    if (nvals < fcb->cmn_struct->veclen && *c != '\0') {
        fcb->cmn_struct->cmn_mean[nvals] = atof(c);
    }
    ckd_free(vallist);
}